

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levenberg_marquardt.cpp
# Opt level: O0

void testSimpleLineFunctor(void)

{
  Status SVar1;
  ostream *poVar2;
  void *pvVar3;
  undefined1 auStack_1f8 [4];
  Status status;
  LevenbergMarquardt<SimpleLineFunctorNumericalDiff,_double> lm;
  SimpleLineFunctorNumericalDiff functor;
  int local_3c;
  undefined1 local_38 [8];
  VectorXd x;
  Point2DVector points;
  uint numberOfPoints;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing f(x) = a x + b function...");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  GeneratePoints((Point2DVector *)
                 &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
                 0x32);
  local_3c = 2;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_38,&local_3c);
  functor.super_NumericalDiff<SimpleLineFunctor,_(Eigen::NumericalDiffMode)0>.epsfcn = 2.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::fill
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_38,
             &functor.super_NumericalDiff<SimpleLineFunctor,_(Eigen::NumericalDiffMode)0>.epsfcn);
  SimpleLineFunctorNumericalDiff::SimpleLineFunctorNumericalDiff
            ((SimpleLineFunctorNumericalDiff *)&lm.prered);
  std::
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  ::operator=((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
               *)&functor,
              (vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
               *)&x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
  ;
  Eigen::LevenbergMarquardt<SimpleLineFunctorNumericalDiff,_double>::LevenbergMarquardt
            ((LevenbergMarquardt<SimpleLineFunctorNumericalDiff,_double> *)auStack_1f8,
             (SimpleLineFunctorNumericalDiff *)&lm.prered);
  SVar1 = Eigen::LevenbergMarquardt<SimpleLineFunctorNumericalDiff,_double>::minimize
                    ((LevenbergMarquardt<SimpleLineFunctorNumericalDiff,_double> *)auStack_1f8,
                     (FVectorType *)local_38);
  poVar2 = std::operator<<((ostream *)&std::cout,"status: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,SVar1);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"x that minimizes the function: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_38);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"lm.parameters.epsfcn: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,lm.parameters.gtol);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"lm.parameters.factor: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,_auStack_1f8);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"lm.parameters.ftol: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,(double)lm.parameters.maxfev);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"lm.parameters.gtol: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,lm.parameters.xtol);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"lm.parameters.maxfev: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,(long)lm.parameters.factor);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"lm.parameters.xtol: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,lm.parameters.ftol);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Eigen::LevenbergMarquardt<SimpleLineFunctorNumericalDiff,_double>::~LevenbergMarquardt
            ((LevenbergMarquardt<SimpleLineFunctorNumericalDiff,_double> *)auStack_1f8);
  SimpleLineFunctorNumericalDiff::~SimpleLineFunctorNumericalDiff
            ((SimpleLineFunctorNumericalDiff *)&lm.prered);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_38);
  std::
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
             *)&x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  return;
}

Assistant:

void testSimpleLineFunctor()
{
    std::cout << "Testing f(x) = a x + b function..." << std::endl;

    unsigned int numberOfPoints = 50;
    Point2DVector points = GeneratePoints(numberOfPoints);

    Eigen::VectorXd x(2);
    x.fill(2.0f);

    SimpleLineFunctorNumericalDiff functor;
    functor.Points = points;
    Eigen::LevenbergMarquardt<SimpleLineFunctorNumericalDiff> lm(functor);

    Eigen::LevenbergMarquardtSpace::Status status = lm.minimize(x);
    std::cout << "status: " << status << std::endl;
    std::cout << "x that minimizes the function: " << std::endl << x << std::endl;
    std::cout <<"lm.parameters.epsfcn: " <<lm.parameters.epsfcn << std::endl;
    std::cout <<"lm.parameters.factor: " <<lm.parameters.factor << std::endl;
    std::cout <<"lm.parameters.ftol: " << lm.parameters.ftol << std::endl;
    std::cout <<"lm.parameters.gtol: " <<lm.parameters.gtol << std::endl;
    std::cout <<"lm.parameters.maxfev: " <<lm.parameters.maxfev << std::endl;
    std::cout <<"lm.parameters.xtol: " <<lm.parameters.xtol << std::endl;

    std::cout << "~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~" << std::endl;

}